

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

either * toml::detail::syntax::floating(spec *s)

{
  character_either *in_RDI;
  char (*in_stack_fffffffffffffe08) [4];
  character_either *this;
  character_either *in_stack_fffffffffffffe18;
  either *in_stack_fffffffffffffe20;
  either *args_1;
  character_either *this_00;
  initializer_list<unsigned_char> in_stack_fffffffffffffe38;
  spec *in_stack_fffffffffffffe58;
  undefined1 local_172;
  undefined1 local_171;
  undefined1 *local_170;
  undefined8 local_168;
  either local_160;
  spec *in_stack_fffffffffffffec8;
  spec *in_stack_ffffffffffffff98;
  
  this_00 = in_RDI;
  dec_int(in_stack_ffffffffffffff98);
  exponent_part(in_stack_fffffffffffffec8);
  fractional_part(in_stack_fffffffffffffe58);
  exponent_part(in_stack_fffffffffffffec8);
  maybe::maybe<toml::detail::sequence>
            ((maybe *)in_stack_fffffffffffffe20,(sequence *)in_stack_fffffffffffffe18);
  sequence::sequence<toml::detail::sequence,toml::detail::maybe>
            ((sequence *)this_00,(sequence *)in_RDI,(maybe *)in_stack_fffffffffffffe20);
  either::either<toml::detail::sequence,toml::detail::sequence>
            ((either *)this_00,(sequence *)in_RDI,(sequence *)in_stack_fffffffffffffe20);
  sequence::sequence<toml::detail::sequence,toml::detail::either>
            ((sequence *)this_00,(sequence *)in_RDI,in_stack_fffffffffffffe20);
  local_172 = 0x2d;
  local_171 = 0x2b;
  local_170 = &local_172;
  local_168 = 2;
  args_1 = &local_160;
  character_either::character_either(this_00,in_stack_fffffffffffffe38);
  maybe::maybe<toml::detail::character_either>((maybe *)args_1,in_stack_fffffffffffffe18);
  this = (character_either *)&stack0xfffffffffffffe50;
  literal::literal<4ul>((literal *)this,in_stack_fffffffffffffe08);
  literal::literal<4ul>((literal *)this,in_stack_fffffffffffffe08);
  either::either<toml::detail::literal,toml::detail::literal>
            ((either *)this_00,(literal *)in_RDI,(literal *)args_1);
  sequence::sequence<toml::detail::maybe,toml::detail::either>
            ((sequence *)this_00,(maybe *)in_RDI,args_1);
  either::either<toml::detail::sequence,toml::detail::sequence>
            ((either *)this_00,(sequence *)in_RDI,(sequence *)args_1);
  sequence::~sequence((sequence *)this);
  either::~either((either *)this);
  literal::~literal((literal *)0x736d7f);
  literal::~literal((literal *)0x736d89);
  maybe::~maybe((maybe *)this);
  character_either::~character_either(this);
  sequence::~sequence((sequence *)this);
  either::~either((either *)this);
  sequence::~sequence((sequence *)this);
  maybe::~maybe((maybe *)this);
  sequence::~sequence((sequence *)this);
  sequence::~sequence((sequence *)this);
  sequence::~sequence((sequence *)this);
  sequence::~sequence((sequence *)this);
  return (either *)this_00;
}

Assistant:

TOML11_INLINE either floating(const spec& s)
{
    return either(
            sequence(
                dec_int(s),
                either(
                    exponent_part(s),
                    sequence(fractional_part(s), maybe(exponent_part(s)))
                )
            ),
            sequence(
                maybe(character_either{char_type('-'), char_type('+')}),
                either(literal("inf"), literal("nan"))
            )
        );
}